

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::
     ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  InvalidInputException *pIVar4;
  long *plVar5;
  undefined8 uVar6;
  ulong in_RCX;
  long in_RSI;
  Vector *in_RDI;
  UnifiedVectorFormat *in_R8;
  TYPE val_val;
  TYPE arg_val;
  long nval;
  idx_t nidx;
  ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,_duckdb::MinMaxFallbackValue,_duckdb::GreaterThan>
  *state;
  idx_t state_idx;
  idx_t val_idx;
  idx_t arg_idx;
  idx_t i;
  ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,_duckdb::MinMaxFallbackValue,_duckdb::GreaterThan>
  **states;
  EXTRA_STATE arg_extra_state;
  EXTRA_STATE val_extra_state;
  UnifiedVectorFormat state_format;
  UnifiedVectorFormat n_format;
  UnifiedVectorFormat arg_format;
  UnifiedVectorFormat val_format;
  Vector *n_vector;
  Vector *arg_vector;
  Vector *val_vector;
  UnifiedVectorFormat *in_stack_fffffffffffffd08;
  ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,_duckdb::MinMaxFallbackValue,_duckdb::GreaterThan>
  *in_stack_fffffffffffffd10;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffd18;
  ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,_duckdb::MinMaxFallbackValue,_duckdb::GreaterThan>
  *in_stack_fffffffffffffd20;
  idx_t in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd48;
  allocator *paVar7;
  undefined1 in_stack_fffffffffffffd50;
  TYPE in_stack_fffffffffffffd54;
  allocator local_291;
  string local_290 [38];
  undefined1 local_26a;
  allocator local_269;
  string local_268 [32];
  long local_248;
  undefined1 local_23a;
  allocator local_239;
  string local_238 [32];
  idx_t local_218;
  ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,_duckdb::MinMaxFallbackValue,_duckdb::GreaterThan>
  *local_210;
  idx_t local_208;
  idx_t local_200;
  idx_t local_1f8;
  UnifiedVectorFormat *local_1f0;
  ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,_duckdb::MinMaxFallbackValue,_duckdb::GreaterThan>
  **local_1e8;
  undefined1 local_171;
  SelectionVector *local_170 [9];
  SelectionVector *local_128 [11];
  SelectionVector *local_d0 [9];
  SelectionVector *local_88 [9];
  Vector *local_40;
  Vector *local_38;
  Vector *local_30;
  UnifiedVectorFormat *local_28;
  ulong local_20;
  long local_10;
  
  local_38 = in_RDI + 0x68;
  local_40 = in_RDI + 0xd0;
  local_30 = in_RDI;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_88);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_d0);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_128);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_170);
  local_171 = MinMaxFixedValue<int>::CreateExtraState(local_30,(idx_t)local_28);
  MinMaxFallbackValue::CreateExtraState
            ((Vector *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  MinMaxFixedValue<int>::PrepareData
            ((Vector *)in_stack_fffffffffffffd20,(idx_t)in_stack_fffffffffffffd18,
             (EXTRA_STATE *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  MinMaxFallbackValue::PrepareData
            ((Vector *)in_stack_fffffffffffffd20,(idx_t)in_stack_fffffffffffffd18,
             (EXTRA_STATE *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  duckdb::Vector::ToUnifiedFormat((ulong)local_40,local_28);
  duckdb::Vector::ToUnifiedFormat(local_20,local_28);
  local_1e8 = UnifiedVectorFormat::
              GetData<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>*>
                        ((UnifiedVectorFormat *)local_170);
  local_1f0 = (UnifiedVectorFormat *)0x0;
  do {
    if (local_28 <= local_1f0) {
      Vector::~Vector((Vector *)in_stack_fffffffffffffd10);
      UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffd10);
      UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffd10);
      UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffd10);
      UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffd10);
      return;
    }
    local_1f8 = SelectionVector::get_index(local_d0[0],(idx_t)local_1f0);
    local_200 = SelectionVector::get_index(local_88[0],(idx_t)local_1f0);
    uVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_fffffffffffffd18,(idx_t)in_stack_fffffffffffffd10);
    if (((bool)uVar1) &&
       (uVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffd18,(idx_t)in_stack_fffffffffffffd10), (bool)uVar2)
       ) {
      local_208 = SelectionVector::get_index(local_170[0],(idx_t)local_1f0);
      local_210 = local_1e8[local_208];
      if ((local_210->is_initialized & 1U) == 0) {
        local_218 = SelectionVector::get_index(local_128[0],(idx_t)local_1f0);
        uVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffd18,(idx_t)in_stack_fffffffffffffd10);
        if (!(bool)uVar3) {
          local_23a = 1;
          pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          paVar7 = &local_239;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_238,"Invalid input for arg_min/arg_max: n value cannot be NULL",paVar7);
          duckdb::InvalidInputException::InvalidInputException(pIVar4,local_238);
          local_23a = 0;
          __cxa_throw(pIVar4,&InvalidInputException::typeinfo,
                      InvalidInputException::~InvalidInputException);
        }
        plVar5 = UnifiedVectorFormat::GetData<long>((UnifiedVectorFormat *)local_128);
        local_248 = plVar5[local_218];
        if (local_248 < 1) {
          local_26a = 1;
          pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_268,"Invalid input for arg_min/arg_max: n value must be > 0",&local_269);
          duckdb::InvalidInputException::InvalidInputException(pIVar4,local_268);
          local_26a = 0;
          __cxa_throw(pIVar4,&InvalidInputException::typeinfo,
                      InvalidInputException::~InvalidInputException);
        }
        if (999999 < local_248) {
          uVar6 = __cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_290,"Invalid input for arg_min/arg_max: n value must be < %d",&local_291)
          ;
          InvalidInputException::InvalidInputException<long>
                    ((InvalidInputException *)
                     CONCAT44(in_stack_fffffffffffffd54,
                              CONCAT13(uVar1,CONCAT12(uVar2,CONCAT11(uVar3,in_stack_fffffffffffffd50
                                                                    )))),in_stack_fffffffffffffd48,
                     in_stack_fffffffffffffd40);
          __cxa_throw(uVar6,&InvalidInputException::typeinfo,
                      InvalidInputException::~InvalidInputException);
        }
        in_stack_fffffffffffffd18 = *(TemplatedValidityMask<unsigned_long> **)(local_10 + 8);
        in_stack_fffffffffffffd10 = local_210;
        UnsafeNumericCast<unsigned_long,long,void>(local_248);
        ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,_duckdb::MinMaxFallbackValue,_duckdb::GreaterThan>
        ::Initialize(in_stack_fffffffffffffd20,(ArenaAllocator *)in_stack_fffffffffffffd18,
                     (idx_t)in_stack_fffffffffffffd10);
      }
      MinMaxFallbackValue::Create(in_stack_fffffffffffffd08,0x849645);
      in_stack_fffffffffffffd54 =
           MinMaxFixedValue<int>::Create
                     ((UnifiedVectorFormat *)in_stack_fffffffffffffd10,
                      (idx_t)in_stack_fffffffffffffd08);
      BinaryAggregateHeap<duckdb::string_t,_int,_duckdb::GreaterThan>::Insert
                (&in_stack_fffffffffffffd20->heap,(ArenaAllocator *)in_stack_fffffffffffffd18,
                 (string_t *)in_stack_fffffffffffffd10,(int *)in_stack_fffffffffffffd08);
    }
    local_1f0 = local_1f0 + 1;
  } while( true );
}

Assistant:

static void ArgMinMaxNUpdate(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count, Vector &state_vector,
                             idx_t count) {

	auto &val_vector = inputs[0];
	auto &arg_vector = inputs[1];
	auto &n_vector = inputs[2];

	UnifiedVectorFormat val_format;
	UnifiedVectorFormat arg_format;
	UnifiedVectorFormat n_format;
	UnifiedVectorFormat state_format;

	auto val_extra_state = STATE::VAL_TYPE::CreateExtraState(val_vector, count);
	auto arg_extra_state = STATE::ARG_TYPE::CreateExtraState(arg_vector, count);

	STATE::VAL_TYPE::PrepareData(val_vector, count, val_extra_state, val_format);
	STATE::ARG_TYPE::PrepareData(arg_vector, count, arg_extra_state, arg_format);

	n_vector.ToUnifiedFormat(count, n_format);
	state_vector.ToUnifiedFormat(count, state_format);

	auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);

	for (idx_t i = 0; i < count; i++) {
		const auto arg_idx = arg_format.sel->get_index(i);
		const auto val_idx = val_format.sel->get_index(i);
		if (!arg_format.validity.RowIsValid(arg_idx) || !val_format.validity.RowIsValid(val_idx)) {
			continue;
		}
		const auto state_idx = state_format.sel->get_index(i);
		auto &state = *states[state_idx];

		// Initialize the heap if necessary and add the input to the heap
		if (!state.is_initialized) {
			static constexpr int64_t MAX_N = 1000000;
			const auto nidx = n_format.sel->get_index(i);
			if (!n_format.validity.RowIsValid(nidx)) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value cannot be NULL");
			}
			const auto nval = UnifiedVectorFormat::GetData<int64_t>(n_format)[nidx];
			if (nval <= 0) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value must be > 0");
			}
			if (nval >= MAX_N) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value must be < %d", MAX_N);
			}
			state.Initialize(aggr_input.allocator, UnsafeNumericCast<idx_t>(nval));
		}

		// Now add the input to the heap
		auto arg_val = STATE::ARG_TYPE::Create(arg_format, arg_idx);
		auto val_val = STATE::VAL_TYPE::Create(val_format, val_idx);

		state.heap.Insert(aggr_input.allocator, arg_val, val_val);
	}
}